

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioContextManager.cpp
# Opt level: O2

void gmlc::networking::AsioContextManager::closeContext(string *contextName)

{
  iterator __position;
  mutex *__mutex;
  shared_ptr<gmlc::networking::AsioContextManager> ptr;
  unique_lock<std::mutex> ctxlock;
  __shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2> local_30;
  unique_lock<std::mutex> local_20;
  
  std::unique_lock<std::mutex>::unique_lock(&local_20,(mutex_type *)contextLock);
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>_>
                       *)contexts_abi_cxx11_,contextName);
  if (__position._M_node != (_Base_ptr)(contexts_abi_cxx11_ + 8)) {
    std::__shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&local_30,
                 (__shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2> *)
                 (__position._M_node + 2));
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<gmlc::networking::AsioContextManager>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<gmlc::networking::AsioContextManager>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<gmlc::networking::AsioContextManager>>>>
    ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<gmlc::networking::AsioContextManager>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<gmlc::networking::AsioContextManager>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<gmlc::networking::AsioContextManager>>>>
                        *)contexts_abi_cxx11_,__position);
    std::unique_lock<std::mutex>::unlock(&local_20);
    if (((local_30._M_ptr)->running)._M_i == stopped) {
      if (((local_30._M_ptr)->loopRet).super___basic_future<void>._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0) {
        std::__basic_future<void>::_M_get_result
                  (&((local_30._M_ptr)->loopRet).super___basic_future<void>);
      }
    }
    else {
      __mutex = &(local_30._M_ptr)->runningLoopLock;
      std::mutex::lock(__mutex);
      std::__uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>::
      reset((__uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_> *
            )&(local_30._M_ptr)->nullwork,(pointer)0x0);
      asio::io_context::stop
                (((local_30._M_ptr)->ictx)._M_t.
                 super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
                 super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl);
      std::__basic_future<void>::_M_get_result
                (&((local_30._M_ptr)->loopRet).super___basic_future<void>);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_30._M_refcount);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void AsioContextManager::closeContext(const std::string& contextName)
{
    std::unique_lock<std::mutex> ctxlock(contextLock);
    auto fnd = contexts.find(contextName);
    //    std::cout << "closing context manager\n";
    if (fnd != contexts.end()) {
        auto ptr = fnd->second;
        contexts.erase(fnd);
        ctxlock.unlock();
        if (ptr->isRunning()) {
            std::lock_guard<std::mutex> nullLock(ptr->runningLoopLock);
            ptr->nullwork.reset();
            ptr->ictx->stop();
            ptr->loopRet.get();
        } else if (ptr->loopRet.valid()) {
            ptr->loopRet.get();
        }
    }
}